

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O2

void __thiscall sznet::Thread::Thread(Thread *this,ThreadFunc *func,string *n)

{
  this->m_started = false;
  this->m_joined = false;
  this->m_pthreadId = 0;
  this->m_tid = 0;
  std::function<void_()>::function(&this->m_func,func);
  std::__cxx11::string::string((string *)&this->m_name,(string *)n);
  CountDownLatch::CountDownLatch(&this->m_latch,1);
  setDefaultName(this);
  return;
}

Assistant:

Thread::Thread(ThreadFunc func, const string& n):
	m_started(false),
	m_joined(false),
	m_pthreadId(0),
	m_tid(0),
	m_func(std::move(func)),
	m_name(n),
	m_latch(1)
{
	setDefaultName();
}